

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O0

uint16_t __thiscall Storage::Disk::HFE::seek_track(HFE *this,Address address)

{
  long lVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  uint16_t track_length;
  long track_offset;
  HFE *this_local;
  Address address_local;
  
  lVar1 = this->track_list_offset_;
  this_local = (HFE *)address;
  iVar4 = HeadPosition::as_int((HeadPosition *)((long)&this_local + 4));
  FileHolder::seek(&this->file_,lVar1 + (iVar4 << 2),0);
  uVar2 = FileHolder::get16le(&this->file_);
  uVar3 = FileHolder::get16le(&this->file_);
  FileHolder::seek(&this->file_,(ulong)uVar2 << 9,0);
  if ((int)this_local != 0) {
    FileHolder::seek(&this->file_,0x100,1);
  }
  return uVar3 / 2;
}

Assistant:

uint16_t HFE::seek_track(Track::Address address) {
	// Get track position and length from the lookup table; data is then always interleaved
	// based on an assumption of two heads.
	file_.seek(track_list_offset_ + address.position.as_int() * 4, SEEK_SET);

	long track_offset = long(file_.get16le()) << 9;		// Track offset, in units of 512 bytes.
	uint16_t track_length = file_.get16le();			// Track length, in bytes, containing both the front and back track.

	file_.seek(track_offset, SEEK_SET);
	if(address.head) file_.seek(256, SEEK_CUR);

	return track_length / 2;	// Divide by two to give the track length for a single side.
}